

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__pnm_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  stbi__context *in_RCX;
  stbi__uint32 *in_RDX;
  stbi__context *in_RSI;
  stbi__uint32 *in_RDI;
  stbi__uint32 in_R8D;
  stbi_uc *out;
  undefined4 in_stack_ffffffffffffffd0;
  uchar *in_stack_fffffffffffffff8;
  uchar *puVar2;
  
  iVar1 = stbi__pnm_info(in_RSI,(int *)in_RDX,(int *)in_RCX,
                         (int *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0));
  if (iVar1 == 0) {
    puVar2 = (uchar *)0x0;
  }
  else {
    in_RSI->img_x = *in_RDI;
    *in_RDX = in_RDI[1];
    in_RCX->img_x = in_RDI[2];
    puVar2 = (uchar *)stbi__malloc(0x114b5f);
    if (puVar2 == (uchar *)0x0) {
      stbi__err("outofmem");
      puVar2 = (uchar *)0x0;
    }
    else {
      stbi__getn(in_RCX,(stbi_uc *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                 (int)((ulong)puVar2 >> 0x20));
      if ((in_R8D != 0) && (in_R8D != in_RDI[2])) {
        puVar2 = stbi__convert_format
                           (in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                            (uint)((ulong)in_RSI >> 0x20),(uint)in_RSI);
      }
    }
  }
  return puVar2;
}

Assistant:

static stbi_uc *stbi__pnm_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi_uc *out;
   if (!stbi__pnm_info(s, (int *)&s->img_x, (int *)&s->img_y, (int *)&s->img_n))
      return 0;
   *x = s->img_x;
   *y = s->img_y;
   *comp = s->img_n;

   out = (stbi_uc *) stbi__malloc(s->img_n * s->img_x * s->img_y);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   stbi__getn(s, out, s->img_n * s->img_x * s->img_y);

   if (req_comp && req_comp != s->img_n) {
      out = stbi__convert_format(out, s->img_n, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }
   return out;
}